

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttype1.c
# Opt level: O3

FT_Error FT_Get_PS_Font_Private(FT_Face face,PS_PrivateRec *afont_private)

{
  FT_Module_Requester p_Var1;
  FT_Error FVar2;
  FT_Module_Interface pvVar3;
  
  if (face == (FT_Face)0x0) {
    FVar2 = 0x23;
  }
  else {
    FVar2 = 6;
    if (afont_private != (PS_PrivateRec *)0x0) {
      p_Var1 = ((face->driver->root).clazz)->get_interface;
      if (p_Var1 != (FT_Module_Requester)0x0) {
        pvVar3 = (*p_Var1)(&face->driver->root,"postscript-info");
        if ((pvVar3 != (FT_Module_Interface)0x0) && (*(code **)((long)pvVar3 + 0x18) != (code *)0x0)
           ) {
          FVar2 = (**(code **)((long)pvVar3 + 0x18))(face,afont_private);
          return FVar2;
        }
      }
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_PS_Font_Private( FT_Face         face,
                          PS_PrivateRec*  afont_private )
  {
    FT_Error           error;
    FT_Service_PsInfo  service;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !afont_private )
      return FT_THROW( Invalid_Argument );

    FT_FACE_FIND_SERVICE( face, service, POSTSCRIPT_INFO );

    if ( service && service->ps_get_font_private )
      error = service->ps_get_font_private( face, afont_private );
    else
      error = FT_THROW( Invalid_Argument );

    return error;
  }